

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  size_t counter;
  htable_iter iter;
  faup_snapshot_t *snapshot_cmp;
  faup_snapshot_t *snapshot;
  char **argv_local;
  int argc_local;
  
  printf("Creating snapshort test\n");
  uVar1 = faup_snapshot_open("test");
  faup_snapshot_append(uVar1,"foo","bar");
  faup_snapshot_append(uVar1,"ahah","ihih");
  faup_snapshot_append(uVar1,"ahah","ihih");
  faup_snapshot_append(uVar1,"ahah","hehe");
  faup_snapshot_debug(uVar1);
  faup_snapshot_write(uVar1,0);
  faup_snapshot_close(uVar1);
  printf("Snapshot closed\n");
  uVar1 = faup_snapshot_read("test");
  faup_snapshot_debug(uVar1);
  faup_snapshot_close(uVar1);
  uVar1 = faup_snapshot_open("arf");
  faup_snapshot_append(uVar1,"foo","bar");
  faup_snapshot_append(uVar1,"ahah","mouarf");
  faup_snapshot_write(uVar1,0);
  faup_snapshot_debug(uVar1);
  faup_snapshot_close(uVar1);
  uVar1 = faup_snapshot_read("test");
  faup_snapshot_close(uVar1);
  uVar1 = faup_snapshot_compare("test","arf");
  printf("\nComparison function:\n");
  printf("====================\n");
  faup_snapshot_output(0,uVar1,_stdout);
  printf("\n===== END OF COMPARISON =====\n");
  faup_snapshot_close(uVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  faup_snapshot_t *snapshot;
  faup_snapshot_t *snapshot_cmp;

  struct htable_iter iter;
  
  size_t counter;
  
  printf("Creating snapshort test\n");
  
  snapshot = faup_snapshot_open("test");
  faup_snapshot_append(snapshot, "foo", "bar");
  faup_snapshot_append(snapshot, "ahah", "ihih");
  faup_snapshot_append(snapshot, "ahah", "ihih");
  faup_snapshot_append(snapshot, "ahah", "hehe");

  faup_snapshot_debug(snapshot);
  faup_snapshot_write(snapshot, NULL);
  faup_snapshot_close(snapshot);

  printf("Snapshot closed\n");

  snapshot = faup_snapshot_read("test");

  faup_snapshot_debug(snapshot);
  
  faup_snapshot_close(snapshot);

  snapshot = faup_snapshot_open("arf");
  faup_snapshot_append(snapshot, "foo", "bar");
  faup_snapshot_append(snapshot, "ahah", "mouarf"); // A
  /* faup_snapshot_append(snapshot, "ahah", "ihih"); */
  /* faup_snapshot_append(snapshot, "ahah", "tagada"); // A */
  /* faup_snapshot_append(snapshot, "jean", "nemard"); */
  /* faup_snapshot_append(snapshot, "jean", "fonce"); */
  faup_snapshot_write(snapshot, NULL);

  faup_snapshot_debug(snapshot);

  faup_snapshot_close(snapshot);

  snapshot = faup_snapshot_read("test");
  faup_snapshot_close(snapshot);
  
  snapshot_cmp = faup_snapshot_compare("test", "arf");

  printf("\nComparison function:\n");
  printf("====================\n");
  faup_snapshot_output(NULL, snapshot_cmp, stdout);
  printf("\n===== END OF COMPARISON =====\n");

  faup_snapshot_close(snapshot_cmp);
  
  return 0;
}